

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtpaths.cpp
# Opt level: O0

QString * searchStringOrError(QCommandLineParser *parser)

{
  qsizetype qVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  int positionalArgumentCount;
  char16_t *str;
  DataPointer *in_stack_ffffffffffffff48;
  QString *in_stack_ffffffffffffff50;
  QList<QString> *this;
  QList<QString> local_68;
  QArrayDataPointer<char16_t> local_50 [2];
  QList<QString> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QCommandLineParser::positionalArguments();
  qVar1 = QList<QString>::size(&local_20);
  QList<QString>::~QList((QList<QString> *)0x10a4ff);
  if ((int)qVar1 != 1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (local_50,(Data *)0x0,L"Exactly one argument needed as searchitem",0x29);
    QString::QString(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    error(in_RDI);
  }
  this = &local_68;
  QCommandLineParser::positionalArguments();
  QList<QString>::constFirst(this);
  QString::QString((QString *)this,(QString *)in_stack_ffffffffffffff48);
  QList<QString>::~QList((QList<QString> *)0x10a59a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString searchStringOrError(QCommandLineParser *parser)
{
    int positionalArgumentCount = parser->positionalArguments().size();
    if (positionalArgumentCount != 1)
        error(QStringLiteral("Exactly one argument needed as searchitem"));
    return parser->positionalArguments().constFirst();
}